

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int expect(frozen *f,char *s,int len,json_type t)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  
  iVar2 = *(int *)&f->end;
  pcVar4 = f->cur;
  iVar1 = capture_ptr(f,pcVar4,t);
  if (iVar1 < 0) {
    return iVar1;
  }
  if (len < 1) {
    pcVar4 = f->cur;
  }
  else {
    uVar5 = iVar2 - (int)pcVar4;
    uVar3 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    do {
      if (uVar5 == uVar3) {
        return -2;
      }
      pcVar4 = f->cur;
      if (pcVar4[uVar3] != s[uVar3]) {
        return -1;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  f->cur = pcVar4 + (uint)len;
  iVar2 = capture_len(f,f->num_tokens + -1,pcVar4 + (uint)len);
  return iVar2;
}

Assistant:

static int expect(struct frozen *f, const char *s, int len, enum json_type t) {
    int i, n = left(f);

    TRY(capture_ptr(f, f->cur, t));
    for (i = 0; i < len; i++) {
        if (i >= n) return JSON_STRING_INCOMPLETE;
        if (f->cur[i] != s[i]) return JSON_STRING_INVALID;
    }
    f->cur += len;
    TRY(capture_len(f, f->num_tokens - 1, f->cur));

    return 0;
}